

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMReader.cpp
# Opt level: O2

Barcode * __thiscall
ZXing::DataMatrix::Reader::decode(Barcode *__return_storage_ptr__,Reader *this,BinaryBitmap *image)

{
  uint uVar1;
  BitMatrix *image_00;
  DetectorResults detectorResult;
  DetectorResults local_120;
  DecoderResult local_e0;
  
  image_00 = BinaryBitmap::getBitMatrix(image);
  if (image_00 == (BitMatrix *)0x0) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
  }
  else {
    uVar1 = *(uint *)(this->super_Reader)._opts;
    Detect(&local_120,image_00,(bool)((byte)uVar1 & 1),SUB41((uVar1 & 2) >> 1,0),
           SUB41((uVar1 & 0x10) >> 4,0));
    if (local_120._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_120._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
    }
    else {
      Decode(&local_e0,&local_120._bits);
      Result::Result(__return_storage_ptr__,&local_e0,&local_120,DataMatrix);
      DecoderResult::~DecoderResult(&local_e0);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_120._bits._bits.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode Reader::decode(const BinaryBitmap& image) const
{
#ifdef __cpp_impl_coroutine
	return FirstOrDefault(decode(image, 1));
#else
	auto binImg = image.getBitMatrix();
	if (binImg == nullptr)
		return {};
	
	auto detectorResult = Detect(*binImg, _opts.tryHarder(), _opts.tryRotate(), _opts.isPure());
	if (!detectorResult.isValid())
		return {};

	return Barcode(Decode(detectorResult.bits()), std::move(detectorResult), BarcodeFormat::DataMatrix);
#endif
}